

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserAnimation.cpp
# Opt level: O0

bool Rml::PropertyParserAnimation::ParseTransition(Property *property,StringList *transition_values)

{
  pointer *this;
  bool bVar1;
  bool bVar2;
  pointer this_00;
  bool bVar3;
  bool bVar4;
  PropertyId id_00;
  int iVar5;
  reference string;
  ulong uVar6;
  Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar7;
  pointer ppVar8;
  size_type sVar9;
  undefined8 uVar10;
  PropertyDefinition *this_01;
  const_iterator cVar11;
  PropertyIdSet PVar12;
  PropertyIdSetIterator PVar13;
  bool local_251;
  undefined1 auStack_208 [7];
  PropertyId id;
  PropertyIdSetIterator __end3;
  PropertyIdSetIterator __begin3;
  PropertyIdSet *__range3;
  PropertyDefinition *definition;
  PropertyIdSet underlying_properties;
  ShorthandDefinition *shorthand;
  int count;
  float number;
  pointer pTStack_1b0;
  pointer local_1a8;
  TransitionList local_198;
  Property local_178;
  int local_124;
  const_iterator local_120;
  undefined1 local_110 [8];
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *argument;
  iterator __end2;
  iterator __begin2;
  StringList *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8 [5];
  bool reverse_adjustment_factor_found;
  bool delay_found;
  bool duration_found;
  StringList arguments;
  PropertyIdSet target_property_ids;
  Transition transition;
  String *single_transition_value;
  const_iterator __end1;
  const_iterator __begin1;
  StringList *__range1;
  vector<Rml::Transition,_std::allocator<Rml::Transition>_> local_58;
  undefined1 local_40 [8];
  TransitionList transition_list;
  StringList *transition_values_local;
  Property *property_local;
  
  local_58.super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  transition_list.transitions.super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)transition_values;
  ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::vector(&local_58);
  TransitionList::TransitionList((TransitionList *)local_40,false,false,&local_58);
  ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::~vector(&local_58);
  this_00 = transition_list.transitions.
            super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end1 = ::std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)transition_list.transitions.
                      super__Vector_base<Rml::Transition,_std::allocator<Rml::Transition>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  single_transition_value =
       (String *)
       ::std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&single_transition_value);
    if (!bVar3) break;
    string = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    Transition::Transition
              ((Transition *)(target_property_ids.defined_ids.super__Base_bitset<2UL>._M_w + 1));
    PropertyIdSet::PropertyIdSet
              ((PropertyIdSet *)
               &arguments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_d8);
    StringUtilities::ExpandString((StringList *)local_d8,string,' ');
    bVar3 = false;
    bVar1 = false;
    bVar2 = false;
    __end2 = ::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(local_d8);
    argument = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(local_d8);
    while( true ) {
      bVar4 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&argument);
      if (!bVar4) break;
      it.mInfo = (uint8_t *)
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      uVar6 = ::std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pTVar7 = &ControlledLifetimeResource<Rml::PropertyParserAnimationData>::operator->
                            ((ControlledLifetimeResource<Rml::PropertyParserAnimationData> *)
                             parser_data)->keywords;
        cVar11 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(pTVar7,(key_type *)it.mInfo);
        it.mKeyVals = (NodePtr)cVar11.mInfo;
        local_110 = (undefined1  [8])cVar11.mKeyVals;
        pTVar7 = &ControlledLifetimeResource<Rml::PropertyParserAnimationData>::operator->
                            ((ControlledLifetimeResource<Rml::PropertyParserAnimationData> *)
                             parser_data)->keywords;
        cVar11 = robin_hood::detail::
                 Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pTVar7);
        local_120 = cVar11;
        bVar4 = robin_hood::detail::
                Table<true,80ul,std::__cxx11::string,Rml::Keyword,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                ::Iter<true>::operator!=((Iter<true> *)local_110,&local_120);
        local_251 = false;
        if (bVar4) {
          ppVar8 = robin_hood::detail::
                   Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::Iter<true>::operator->((Iter<true> *)local_110);
          local_251 = Keyword::ValidTransition(&ppVar8->second);
        }
        if (local_251 == false) {
          shorthand._4_4_ = 0.0;
          shorthand._0_4_ = 0;
          uVar10 = ::std::__cxx11::string::c_str();
          iVar5 = __isoc99_sscanf(uVar10,"%fs%n",(long)&shorthand + 4,&shorthand);
          if (iVar5 == 1) {
            if ((int)shorthand < 1) {
              if (bVar2) {
                property_local._7_1_ = 0;
                local_124 = 1;
                goto LAB_005dfcdd;
              }
              bVar2 = true;
              transition.duration = shorthand._4_4_;
            }
            else if (bVar3) {
              if (bVar1) {
                property_local._7_1_ = 0;
                local_124 = 1;
                goto LAB_005dfcdd;
              }
              bVar1 = true;
            }
            else {
              bVar3 = true;
              transition.tween.callback._0_4_ = shorthand._4_4_;
            }
          }
          else {
            underlying_properties.defined_ids.super__Base_bitset<2UL>._M_w[1] =
                 (_WordT)StyleSheetSpecification::GetShorthand((String *)it.mInfo);
            if ((ShorthandDefinition *)
                underlying_properties.defined_ids.super__Base_bitset<2UL>._M_w[1] ==
                (ShorthandDefinition *)0x0) {
              this_01 = StyleSheetSpecification::GetProperty((String *)it.mInfo);
              if (this_01 == (PropertyDefinition *)0x0) {
                property_local._7_1_ = 0;
                local_124 = 1;
                goto LAB_005dfcdd;
              }
              id_00 = PropertyDefinition::GetId(this_01);
              PropertyIdSet::Insert
                        ((PropertyIdSet *)
                         &arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,id_00);
            }
            else {
              PVar12 = StyleSheetSpecification::GetShorthandUnderlyingProperties
                                 (((ShorthandDefinition *)
                                  underlying_properties.defined_ids.super__Base_bitset<2UL>._M_w[1])
                                  ->id);
              underlying_properties.defined_ids.super__Base_bitset<2UL>._M_w[0] =
                   PVar12.defined_ids.super__Base_bitset<2UL>._M_w[1];
              definition = PVar12.defined_ids.super__Base_bitset<2UL>._M_w[0];
              PropertyIdSet::operator|=
                        ((PropertyIdSet *)
                         &arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (PropertyIdSet *)&definition);
            }
          }
        }
        else {
          ppVar8 = robin_hood::detail::
                   Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::Iter<true>::operator->((Iter<true> *)local_110);
          if ((ppVar8->second).type == None) {
            sVar9 = ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::size
                              ((vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)
                               &transition_list);
            if (sVar9 == 0) {
              _count = (pointer)0x0;
              pTStack_1b0 = (pointer)0x0;
              local_1a8 = (pointer)0x0;
              ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::vector
                        ((vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)&count);
              TransitionList::TransitionList
                        (&local_198,true,false,
                         (vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)&count);
              Property::Property<Rml::TransitionList>(&local_178,&local_198,TRANSITION,-1);
              Property::operator=(property,&local_178);
              Property::~Property(&local_178);
              TransitionList::~TransitionList(&local_198);
              ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::~vector
                        ((vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)&count);
              property_local._7_1_ = 1;
              local_124 = 1;
            }
            else {
              property_local._7_1_ = 0;
              local_124 = 1;
            }
            goto LAB_005dfcdd;
          }
          ppVar8 = robin_hood::detail::
                   Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::Iter<true>::operator->((Iter<true> *)local_110);
          if ((ppVar8->second).type == All) {
            sVar9 = ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::size
                              ((vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)
                               &transition_list);
            if (sVar9 != 0) {
              property_local._7_1_ = 0;
              local_124 = 1;
              goto LAB_005dfcdd;
            }
            local_40[1] = true;
          }
          else {
            ppVar8 = robin_hood::detail::
                     Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::Iter<true>::operator->((Iter<true> *)local_110);
            if ((ppVar8->second).type == Tween) {
              robin_hood::detail::
              Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Keyword,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::Iter<true>::operator->((Iter<true> *)local_110);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    if ((local_40[1] & 1U) == 0) {
LAB_005dfb52:
      if ((local_40[1] & 1U) == 0) {
        bVar3 = PropertyIdSet::Empty
                          ((PropertyIdSet *)
                           &arguments.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar3) goto LAB_005dfba5;
      }
      if (((transition.tween.callback._0_4_ <= 0.0) || (transition.duration < 0.0)) ||
         (1.0 < transition.duration)) goto LAB_005dfba5;
      if ((local_40[1] & 1U) == 0) {
        this = &arguments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
        PVar13 = PropertyIdSet::begin((PropertyIdSet *)this);
        __end3.id_index = (size_t)PVar13.container;
        PVar13 = PropertyIdSet::end((PropertyIdSet *)this);
        while( true ) {
          __end3.container = (PropertyIdSet *)PVar13.id_index;
          _auStack_208 = PVar13.container;
          bVar3 = PropertyIdSetIterator::operator!=
                            ((PropertyIdSetIterator *)&__end3.id_index,
                             (PropertyIdSetIterator *)auStack_208);
          if (!bVar3) break;
          target_property_ids.defined_ids.super__Base_bitset<2UL>._M_w[1]._0_1_ =
               PropertyIdSetIterator::operator*((PropertyIdSetIterator *)&__end3.id_index);
          ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::push_back
                    ((vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)&transition_list,
                     (value_type *)
                     (target_property_ids.defined_ids.super__Base_bitset<2UL>._M_w + 1));
          PropertyIdSetIterator::operator++((PropertyIdSetIterator *)&__end3.id_index);
          PVar13.id_index = (size_t)__end3.container;
          PVar13.container = _auStack_208;
        }
      }
      else {
        target_property_ids.defined_ids.super__Base_bitset<2UL>._M_w[1]._0_1_ = Invalid;
        ::std::vector<Rml::Transition,_std::allocator<Rml::Transition>_>::push_back
                  ((vector<Rml::Transition,_std::allocator<Rml::Transition>_> *)&transition_list,
                   (value_type *)(target_property_ids.defined_ids.super__Base_bitset<2UL>._M_w + 1))
        ;
      }
      local_124 = 0;
    }
    else {
      bVar3 = PropertyIdSet::Empty
                        ((PropertyIdSet *)
                         &arguments.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar3) goto LAB_005dfb52;
LAB_005dfba5:
      property_local._7_1_ = 0;
      local_124 = 1;
    }
LAB_005dfcdd:
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_d8);
    if (local_124 != 0) goto LAB_005dfd3b;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  Variant::operator=(&property->value,(TransitionList *)local_40);
  property->unit = TRANSITION;
  property_local._7_1_ = 1;
  local_124 = 1;
LAB_005dfd3b:
  TransitionList::~TransitionList((TransitionList *)local_40);
  return (bool)(property_local._7_1_ & 1);
}

Assistant:

bool PropertyParserAnimation::ParseTransition(Property& property, const StringList& transition_values)
{
	TransitionList transition_list{false, false, {}};

	for (const String& single_transition_value : transition_values)
	{
		Transition transition;
		PropertyIdSet target_property_ids;

		StringList arguments;
		StringUtilities::ExpandString(arguments, single_transition_value, ' ');

		bool duration_found = false;
		bool delay_found = false;
		bool reverse_adjustment_factor_found = false;

		for (auto& argument : arguments)
		{
			if (argument.empty())
				continue;

			// See if we have a <keyword> or <tween> specifier as defined in keywords
			auto it = parser_data->keywords.find(argument);
			if (it != parser_data->keywords.end() && it->second.ValidTransition())
			{
				if (it->second.type == KeywordType::None)
				{
					if (transition_list.transitions.size() > 0) // The none keyword can not be part of multiple definitions
						return false;
					property = Property{TransitionList{true, false, {}}, Unit::TRANSITION};
					return true;
				}
				else if (it->second.type == KeywordType::All)
				{
					if (transition_list.transitions.size() > 0) // The all keyword can not be part of multiple definitions
						return false;
					transition_list.all = true;
				}
				else if (it->second.type == KeywordType::Tween)
				{
					transition.tween = it->second.tween;
				}
			}
			else
			{
				// Either <duration>, <delay> or a <property name>
				float number = 0.0f;
				int count = 0;

				if (sscanf(argument.c_str(), "%fs%n", &number, &count) == 1)
				{
					// Found a number, if there was an 's' unit, count will be positive
					if (count > 0)
					{
						// Duration or delay was assigned
						if (!duration_found)
						{
							duration_found = true;
							transition.duration = number;
						}
						else if (!delay_found)
						{
							delay_found = true;
							transition.delay = number;
						}
						else
							return false;
					}
					else
					{
						// No 's' unit means reverse adjustment factor was found
						if (!reverse_adjustment_factor_found)
						{
							reverse_adjustment_factor_found = true;
							transition.reverse_adjustment_factor = number;
						}
						else
							return false;
					}
				}
				else
				{
					// Must be a property name or shorthand, expand now
					if (auto shorthand = StyleSheetSpecification::GetShorthand(argument))
					{
						PropertyIdSet underlying_properties = StyleSheetSpecification::GetShorthandUnderlyingProperties(shorthand->id);
						target_property_ids |= underlying_properties;
					}
					else if (auto definition = StyleSheetSpecification::GetProperty(argument))
					{
						// Single property
						target_property_ids.Insert(definition->GetId());
					}
					else
					{
						// Unknown property name
						return false;
					}
				}
			}
		}

		// Validate the parsed transition
		if ((transition_list.all && !target_property_ids.Empty())    //
			|| (!transition_list.all && target_property_ids.Empty()) //
			|| transition.duration <= 0.0f                           //
			|| transition.reverse_adjustment_factor < 0.0f           //
			|| transition.reverse_adjustment_factor > 1.0f           //
		)
		{
			return false;
		}

		if (transition_list.all)
		{
			transition.id = PropertyId::Invalid;
			transition_list.transitions.push_back(transition);
		}
		else
		{
			for (const PropertyId id : target_property_ids)
			{
				transition.id = id;
				transition_list.transitions.push_back(transition);
			}
		}
	}

	property.value = std::move(transition_list);
	property.unit = Unit::TRANSITION;

	return true;
}